

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS
ref_cell_node_list_around
          (REF_CELL ref_cell,REF_INT node,REF_INT max_node,REF_INT *nnode,REF_INT *node_list)

{
  bool bVar1;
  REF_INT local_54;
  REF_INT local_50;
  int local_4c;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL already_have_it;
  REF_INT haves;
  REF_INT cell_node;
  REF_INT item;
  REF_INT cell;
  REF_INT *node_list_local;
  REF_INT *nnode_local;
  REF_INT max_node_local;
  REF_INT node_local;
  REF_CELL ref_cell_local;
  
  *nnode = 0;
  if ((node < 0) || (ref_cell->ref_adj->nnode <= node)) {
    local_4c = -1;
  }
  else {
    local_4c = ref_cell->ref_adj->first[node];
  }
  haves = local_4c;
  if (local_4c == -1) {
    local_50 = -1;
  }
  else {
    local_50 = ref_cell->ref_adj->item[local_4c].ref;
  }
  cell_node = local_50;
  do {
    if (haves == -1) {
      return 0;
    }
    for (already_have_it = 0; already_have_it < ref_cell->node_per;
        already_have_it = already_have_it + 1) {
      if (node != ref_cell->c2n[already_have_it + ref_cell->size_per * cell_node]) {
        bVar1 = false;
        for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < *nnode;
            ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
          if (node_list[ref_private_macro_code_rss] ==
              ref_cell->c2n[already_have_it + ref_cell->size_per * cell_node]) {
            bVar1 = true;
            break;
          }
        }
        if (!bVar1) {
          if (max_node <= *nnode) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                   0x4e8,"ref_cell_node_list_around",7,"max_node too small");
            return 7;
          }
          node_list[*nnode] = ref_cell->c2n[already_have_it + ref_cell->size_per * cell_node];
          *nnode = *nnode + 1;
        }
      }
    }
    haves = ref_cell->ref_adj->item[haves].next;
    if (haves == -1) {
      local_54 = -1;
    }
    else {
      local_54 = ref_cell->ref_adj->item[haves].ref;
    }
    cell_node = local_54;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cell_node_list_around(REF_CELL ref_cell, REF_INT node,
                                             REF_INT max_node, REF_INT *nnode,
                                             REF_INT *node_list) {
  REF_INT cell, item, cell_node, haves;
  REF_BOOL already_have_it;

  *nnode = 0;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      if (node == ref_cell_c2n(ref_cell, cell_node, cell)) continue;
      already_have_it = REF_FALSE;
      for (haves = 0; haves < *nnode; haves++)
        if (node_list[haves] == ref_cell_c2n(ref_cell, cell_node, cell)) {
          already_have_it = REF_TRUE;
          break;
        }
      if (!already_have_it) {
        if (*nnode >= max_node) {
          RSS(REF_INCREASE_LIMIT, "max_node too small");
        }
        node_list[*nnode] = ref_cell_c2n(ref_cell, cell_node, cell);
        (*nnode)++;
      }
    }
  }

  return REF_SUCCESS;
}